

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O3

void __thiscall DataSet::load(DataSet *this,string *filepath,ReadInfo *info)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int iVar1;
  undefined4 uVar2;
  iterator __position;
  undefined4 uVar3;
  _Alloc_hider _Var4;
  char cVar5;
  int *piVar6;
  long lVar7;
  istream *piVar8;
  vector<double,_std::allocator<double>_> *this_01;
  undefined8 uVar9;
  uint uVar10;
  uint index;
  pointer pcVar11;
  string line;
  string token;
  stringstream stream_1;
  ifstream file;
  stringstream stream;
  char *local_5b8;
  long local_5b0;
  char local_5a8;
  undefined7 uStack_5a7;
  value_type local_598;
  DataSet *local_578;
  ReadInfo *local_570;
  Matrix<double> *local_568;
  pointer local_560;
  long local_558;
  long local_550;
  char *local_548;
  undefined8 local_540;
  char local_538;
  undefined7 uStack_537;
  ios_base local_4c8 [264];
  long local_3c0 [4];
  byte abStack_3a0 [488];
  long local_1b8 [2];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  local_578 = this;
  local_570 = info;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_5b0 = 0;
  local_5a8 = '\0';
  local_598._M_string_length = 0;
  local_598.field_2._M_local_buf[0] = '\0';
  local_5b8 = &local_5a8;
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::ifstream::ifstream(local_3c0,(string *)filepath,_S_in);
  if ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) != 0) {
    std::operator<<((ostream *)&std::cout,"ERROR [loading file]: Couldn\'t open up the file!\n");
LAB_001030a6:
    exit(1);
  }
  local_550 = 0;
  local_558 = 0;
  if (local_570->shape_skip != false) {
LAB_00102cf6:
    if (local_570->header_skip == false) {
      cVar5 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) + (char)local_3c0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3c0,(string *)&local_5b8,cVar5);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&local_548,(string *)&local_5b8,_S_out|_S_in);
      this_00 = &local_578->m_labels;
      while (piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&local_548,(string *)&local_598,','),
            ((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,&local_598);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_548);
      std::ios_base::~ios_base(local_4c8);
    }
    local_568 = &local_578->m_matrix;
    index = 0;
    do {
      do {
        cVar5 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) +
                                (char)(istream *)local_3c0);
        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_3c0,(string *)&local_5b8,cVar5);
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
          if ((uint)local_558 != index && (uint)local_558 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"WARNING [loading file]: Shape doesn\'t match!\n",0x2d)
            ;
          }
          std::ifstream::close();
          std::ifstream::~ifstream(local_3c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598._M_dataplus._M_p != &local_598.field_2) {
            operator_delete(local_598._M_dataplus._M_p,
                            CONCAT71(local_598.field_2._M_allocated_capacity._1_7_,
                                     local_598.field_2._M_local_buf[0]) + 1);
          }
          if (local_5b8 != &local_5a8) {
            operator_delete(local_5b8,CONCAT71(uStack_5a7,local_5a8) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          return;
        }
      } while ((local_5b0 == 0) && (local_570->empty_line_skip != false));
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_5b8,local_5b0);
      Matrix<double>::add_row(local_568,1);
      uVar10 = 0;
      while (piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_1b8,(string *)&local_598,','),
            ((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
        this_01 = Matrix<double>::operator[](local_568,index);
        _Var4._M_p = local_598._M_dataplus._M_p;
        piVar6 = __errno_location();
        iVar1 = *piVar6;
        *piVar6 = 0;
        pcVar11 = (pointer)strtod(_Var4._M_p,&local_548);
        if (local_548 == _Var4._M_p) {
          std::__throw_invalid_argument("stod");
LAB_00103068:
          std::__throw_out_of_range("stod");
          goto LAB_00103074;
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar1;
        }
        else if (*piVar6 == 0x22) goto LAB_00103068;
        __position._M_current =
             (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_560 = pcVar11;
        if (__position._M_current ==
            (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (this_01,__position,(double *)&local_560);
        }
        else {
          *__position._M_current = (double)pcVar11;
          (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar10 = uVar10 + 1;
      }
      if (((uint)local_550 != uVar10 && (uint)local_550 != 0) ||
         (uVar2 = (local_568->m_shape).n_row, uVar3 = (local_568->m_shape).n_col,
         uVar3 != uVar10 && index != 0)) {
LAB_00103074:
        std::operator<<((ostream *)&std::cout,"ERROR [file loading]: Different dimensions!\n");
        goto LAB_001030a6;
      }
      (local_578->m_matrix).m_shape.n_row = uVar2;
      (local_578->m_matrix).m_shape.n_col = uVar10;
      local_540 = 0;
      local_538 = '\0';
      local_548 = &local_538;
      std::__cxx11::stringbuf::str(local_1a0);
      if (local_548 != &local_538) {
        operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
      }
      index = index + 1;
      std::ios::clear((int)*(undefined8 *)(local_1b8[0] + -0x18) + (int)local_1b8);
    } while( true );
  }
  cVar5 = std::ios::widen((char)&local_5b8 + (char)*(long *)(local_3c0[0] + -0x18) + -8);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3c0,(string *)&local_5b8,cVar5);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&local_548,(string *)&local_5b8,_S_out|_S_in);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_548,(string *)&local_598,',');
  _Var4._M_p = local_598._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  *piVar6 = 0;
  lVar7 = strtol(_Var4._M_p,&local_560,10);
  if (local_560 == _Var4._M_p) {
    std::__throw_invalid_argument("stoi");
LAB_001030bc:
    std::__throw_out_of_range("stoi");
  }
  else {
    local_558 = lVar7;
    if (((int)lVar7 != lVar7) || (*piVar6 == 0x22)) goto LAB_001030bc;
    if (*piVar6 == 0) {
      *piVar6 = iVar1;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_548,(string *)&local_598,',');
    _Var4._M_p = local_598._M_dataplus._M_p;
    iVar1 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol(local_598._M_dataplus._M_p,&local_560,10);
    if (local_560 != _Var4._M_p) {
      local_550 = lVar7;
      if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar1;
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_548);
        std::ios_base::~ios_base(local_4c8);
        goto LAB_00102cf6;
      }
      goto LAB_001030d4;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_001030d4:
  uVar9 = std::__throw_out_of_range("stoi");
  std::ifstream::~ifstream(local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,
                    CONCAT71(local_598.field_2._M_allocated_capacity._1_7_,
                             local_598.field_2._M_local_buf[0]) + 1);
  }
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8,CONCAT71(uStack_5a7,local_5a8) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  _Unwind_Resume(uVar9);
}

Assistant:

void DataSet::load(const std::string& filepath, const ReadInfo& info){
    unsigned n_row=0, n_col=0;
    Shape shape;
    
    std::stringstream stream;
    std::string line, token;
    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [loading file]: Couldn't open up the file!\n";
        exit(1);
    }

    if(!info.shape_skip){
        std::getline(file, line);
        std::stringstream stream(line);

        std::getline(stream, token, ',');
        shape.n_row=std::stoi(token);
        std::getline(stream, token, ',');
        shape.n_col=std::stoi(token);
    }
    if(!info.header_skip){
        std::getline(file, line);
        std::stringstream stream(line);
        while(std::getline(stream, token, ',')){
            m_labels.push_back(token);
        }
    }

    while(std::getline(file, line)){
        if(line.empty() && info.empty_line_skip) continue;

        stream<<line;
        m_matrix.add_row();
        while(std::getline(stream, token, ',')){
            m_matrix[n_row].push_back(std::stod(token));
            ++n_col;
        }

        if( (shape.n_col && shape.n_col!=n_col) || 
            (n_row && n_col!=m_matrix.shape().n_col) ){
            std::cout<<"ERROR [file loading]: Different dimensions!\n";
            exit(1);
        }

        m_matrix.set_shape(m_matrix.shape().n_row, n_col);
        n_col=0; ++n_row;
        stream.str(std::string());
        stream.clear();
    }

    if(shape.n_row && shape.n_row!=n_row){
        std::cout<<"WARNING [loading file]: Shape doesn't match!\n";
    }

    file.close();
}